

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

void dgrminer::printOutEdges
               (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *edge_list)

{
  ostream *poVar1;
  int j;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PRINTING EDGE LIST - START",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if ((edge_list->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (edge_list->super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      lVar2 = 0;
      do {
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            *(int *)((long)((edge_list->
                                            super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                    lVar2 * 4 + lVar3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < (ulong)((long)(edge_list->
                                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(edge_list->
                                   super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"PRINTING EDGE LIST - START",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void printOutEdges(std::vector<std::array<int, 8>> &edge_list)
    {
        std::cout << "PRINTING EDGE LIST - START" << std::endl;
        for (size_t i = 0; i < edge_list.size(); i++)
        {

            for (int j = 0; j < 8; j++)
            {
                std::cout << edge_list[i][j] << ", ";
            }
            std::cout << std::endl;
        }
        std::cout << "PRINTING EDGE LIST - START" << std::endl;
    }